

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O0

chain * __thiscall
hashset<hashtableentry<char_*,_int>_>::insert(hashset<hashtableentry<char_*,_int>_> *this,uint h)

{
  chain *pcVar1;
  chainchunk *this_00;
  chain *c;
  int i;
  chainchunk *chunk;
  uint h_local;
  hashset<hashtableentry<char_*,_int>_> *this_local;
  
  if (this->unused == (chain *)0x0) {
    this_00 = (chainchunk *)operator_new(0x608);
    chainchunk::chainchunk(this_00);
    this_00->next = this->chunks;
    this->chunks = this_00;
    for (c._0_4_ = 0; (int)c < 0x3f; c._0_4_ = (int)c + 1) {
      this_00->chains[(int)c].next = this_00->chains + ((int)c + 1);
    }
    this_00->chains[0x3f].next = this->unused;
    this->unused = (chain *)this_00;
  }
  pcVar1 = this->unused;
  this->unused = this->unused->next;
  pcVar1->next = this->chains[h];
  this->chains[h] = pcVar1;
  this->numelems = this->numelems + 1;
  return pcVar1;
}

Assistant:

chain *insert(uint h)
    {
        if(!unused)
        {
            chainchunk *chunk = new chainchunk;
            chunk->next = chunks;
            chunks = chunk;
            loopi(CHUNKSIZE-1) chunk->chains[i].next = &chunk->chains[i+1];
            chunk->chains[CHUNKSIZE-1].next = unused;
            unused = chunk->chains;
        }
        chain *c = unused;
        unused = unused->next;
        c->next = chains[h];
        chains[h] = c;
        numelems++;
        return c;
    }